

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

void __thiscall
jsonnet::internal::Function::Function
          (Function *this,LocationRange *lr,Fodder *open_fodder,Fodder *paren_left_fodder,
          ArgParams *params,bool trailing_comma,Fodder *paren_right_fodder,AST *body)

{
  AST::AST(&this->super_AST,lr,AST_FUNCTION,open_fodder);
  (this->super_AST)._vptr_AST = (_func_int **)&PTR__Function_002489d8;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->parenLeftFodder,paren_left_fodder);
  std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::vector
            (&this->params,params);
  this->trailingComma = trailing_comma;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->parenRightFodder,paren_right_fodder);
  this->body = body;
  return;
}

Assistant:

Function(const LocationRange &lr, const Fodder &open_fodder, const Fodder &paren_left_fodder,
             const ArgParams &params, bool trailing_comma, const Fodder &paren_right_fodder,
             AST *body)
        : AST(lr, AST_FUNCTION, open_fodder),
          parenLeftFodder(paren_left_fodder),
          params(params),
          trailingComma(trailing_comma),
          parenRightFodder(paren_right_fodder),
          body(body)
    {
    }